

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

void communicate(int *file_descriptors,Arguments *args)

{
  __pid_t _Var1;
  
  _Var1 = fork();
  if (_Var1 == 0) {
    client_communicate(file_descriptors,args);
    return;
  }
  if (_Var1 != -1) {
    server_communicate(file_descriptors,args);
    return;
  }
  throw("Error forking process");
}

Assistant:

void communicate(int file_descriptors[2], struct Arguments *args) {
	// For the process ID of the spawned child process
	pid_t pid;

	// Fork a child process
	if ((pid = fork()) == -1) {
		throw("Error forking process");
	}

	// fork() returns 0 for the child process
	if (pid == (pid_t)0) {
		client_communicate(file_descriptors, args);
	}

	else {
		server_communicate(file_descriptors, args);
	}
}